

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor.cpp
# Opt level: O3

void __thiscall
FIX::SocketMonitor::processExceptSet(SocketMonitor *this,Strategy *strategy,fd_set *exceptSet)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_node_base *p_Var3;
  Sockets sockets;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _Stack_58;
  
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&_Stack_58,&(this->m_connectSockets)._M_t);
  for (p_Var3 = _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &_Stack_58._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    _Var1 = p_Var3[1]._M_color;
    _Var2 = _Var1 + 0x3f;
    if (-1 < (int)_Var1) {
      _Var2 = _Var1;
    }
    if (((ulong)exceptSet->fds_bits[(int)_Var2 >> 6] >> ((ulong)_Var1 & 0x3f) & 1) != 0) {
      (*strategy->_vptr_Strategy[5])(strategy,this);
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&_Stack_58);
  return;
}

Assistant:

void SocketMonitor::processExceptSet( Strategy& strategy, fd_set& exceptSet )
{
#ifdef _MSC_VER
  for ( unsigned i = 0; i < exceptSet.fd_count; ++i )
  {
    int s = exceptSet.fd_array[ i ];
    strategy.onError( *this, s );
  }
#else
    Sockets::iterator i;
    Sockets sockets = m_connectSockets;
    for ( i = sockets.begin(); i != sockets.end(); ++i )
    {
      int s = *i;
      if ( !FD_ISSET( *i, &exceptSet ) )
        continue;
      strategy.onError( *this, s );
    }
#endif
}